

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPrimalHeuristics.cpp
# Opt level: O2

void __thiscall HighsPrimalHeuristics::feasibilityPump(HighsPrimalHeuristics *this)

{
  HighsRandom *this_00;
  double dVar1;
  _Head_base<0UL,_HighsMipSolverData_*,_false> _Var2;
  int *piVar3;
  pointer pdVar4;
  int64_t iVar5;
  HighsInt HVar6;
  uint uVar7;
  ulong uVar8;
  int *piVar9;
  long lVar10;
  int iVar11;
  bool bVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  double dVar15;
  pair<std::__detail::_Node_iterator<std::vector<int,_std::allocator<int>_>,_true,_true>,_bool>
  pVar16;
  Status local_5804;
  vector<int,_std::allocator<int>_> referencepoint;
  int local_57dc;
  vector<double,_std::allocator<double>_> roundedsol;
  vector<double,_std::allocator<double>_> cost;
  vector<int,_std::allocator<int>_> fracintset;
  vector<double,_std::allocator<double>_> fracintcost;
  vector<int,_std::allocator<int>_> mask;
  unordered_set<std::vector<int,_std::allocator<int>_>,_HighsVectorHasher,_HighsVectorEqual,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  referencepoints;
  HighsDomain localdom;
  HighsLpRelaxation lprelax;
  
  HighsLpRelaxation::HighsLpRelaxation
            (&lprelax,&((this->mipsolver->mipdata_)._M_t.
                        super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                        .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->lp);
  referencepoints._M_h._M_buckets = &referencepoints._M_h._M_single_bucket;
  referencepoints._M_h._M_bucket_count = 1;
  referencepoints._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  referencepoints._M_h._M_element_count = 0;
  referencepoints._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  referencepoints._M_h._M_rehash_policy._M_next_resize = 0;
  referencepoints._M_h._M_single_bucket = (__node_base_ptr)0x0;
  roundedsol.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  roundedsol.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  roundedsol.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_5804 = HighsLpRelaxation::resolveLp(&lprelax,(HighsDomain *)0x0);
  this->lp_iterations = this->lp_iterations + lprelax.numlpiters;
  fracintcost.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  fracintcost.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  fracintcost.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  fracintset.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  fracintset.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  fracintset.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  localdom.changedcolsflags_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(localdom.changedcolsflags_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,1);
  std::vector<int,_std::allocator<int>_>::vector
            (&mask,(long)this->mipsolver->model_->num_col_,(value_type_conflict2 *)&localdom,
             (allocator_type *)&cost);
  localdom.changedcolsflags_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            (&cost,(long)this->mipsolver->model_->num_col_,(value_type_conflict1 *)&localdom,
             (allocator_type *)&referencepoint);
  std::__cxx11::string::string((string *)&localdom,"simplex_strategy",(allocator *)&referencepoint);
  Highs::setOptionValue(&lprelax.lpsolver,(string *)&localdom,4);
  std::__cxx11::string::~string((string *)&localdom);
  HighsLpRelaxation::setObjectiveLimit(&lprelax,INFINITY);
  std::__cxx11::string::string
            ((string *)&localdom,"primal_simplex_bound_perturbation_multiplier",
             (allocator *)&referencepoint);
  Highs::setOptionValue(&lprelax.lpsolver,(string *)&localdom,0.0);
  std::__cxx11::string::~string((string *)&localdom);
  HighsLpRelaxation::setIterationLimit
            (&lprelax,(int)(((this->mipsolver->mipdata_)._M_t.
                             super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                             .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->
                            avgrootlpiters * 5.0));
  this_00 = &this->randgen;
  do {
    if (lprelax.fractionalints.
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_start ==
        lprelax.fractionalints.
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_finish) {
LAB_002dc5b6:
      if ((local_5804 == kUnscaledPrimalFeasible) || (local_5804 == kOptimal)) {
        HighsMipSolverData::addIncumbent
                  ((this->mipsolver->mipdata_)._M_t.
                   super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                   .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl,
                   &lprelax.lpsolver.solution_.col_value,lprelax.objective,2,true,false);
      }
LAB_002dc5ed:
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&cost.super__Vector_base<double,_std::allocator<double>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&mask.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&fracintset.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&fracintcost.super__Vector_base<double,_std::allocator<double>_>);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&roundedsol.super__Vector_base<double,_std::allocator<double>_>);
      std::
      _Hashtable<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>,_std::__detail::_Identity,_HighsVectorEqual,_HighsVectorHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable(&referencepoints._M_h);
      HighsLpRelaxation::~HighsLpRelaxation(&lprelax);
      return;
    }
    std::vector<double,_std::allocator<double>_>::operator=
              (&roundedsol,&lprelax.lpsolver.solution_.col_value);
    referencepoint.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    referencepoint.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    referencepoint.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    _Var2._M_head_impl =
         (this->mipsolver->mipdata_)._M_t.
         super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
         super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
         super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
    std::vector<int,_std::allocator<int>_>::reserve
              (&referencepoint,
               (long)*(pointer *)((long)&(_Var2._M_head_impl)->integer_cols + 8) -
               *(long *)&((_Var2._M_head_impl)->integer_cols).
                         super__Vector_base<int,_std::allocator<int>_> >> 2);
    HighsDomain::HighsDomain
              (&localdom,
               &((this->mipsolver->mipdata_)._M_t.
                 super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                 .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->domain);
    _Var2._M_head_impl =
         (this->mipsolver->mipdata_)._M_t.
         super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
         super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
         super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
    piVar3 = *(pointer *)((long)&(_Var2._M_head_impl)->integer_cols + 8);
    for (piVar9 = *(int **)&((_Var2._M_head_impl)->integer_cols).
                            super__Vector_base<int,_std::allocator<int>_>; piVar9 != piVar3;
        piVar9 = piVar9 + 1) {
      iVar11 = *piVar9;
      dVar1 = roundedsol.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[iVar11];
      dVar15 = HighsRandom::closedFraction(this_00);
      dVar1 = floor(dVar1 + dVar15 * 0.19999999999999996 + 0.4);
      dVar15 = localdom.col_lower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[iVar11];
      if (localdom.col_lower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[iVar11] <= dVar1) {
        dVar15 = dVar1;
      }
      dVar1 = localdom.col_upper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[iVar11];
      uVar13 = SUB84(dVar1,0);
      uVar14 = (undefined4)((ulong)dVar1 >> 0x20);
      if (dVar15 <= dVar1) {
        uVar13 = SUB84(dVar15,0);
        uVar14 = (undefined4)((ulong)dVar15 >> 0x20);
      }
      roundedsol.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start[iVar11] = (double)CONCAT44(uVar14,uVar13);
      local_57dc = (int)(double)CONCAT44(uVar14,uVar13);
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(&referencepoint,&local_57dc);
      if (localdom.infeasible_ == false) {
        HighsDomain::fixCol(&localdom,iVar11,(double)CONCAT44(uVar14,uVar13),(Reason)0xffffffff);
        if (localdom.infeasible_ == false) {
          HighsDomain::propagate(&localdom);
          if (localdom.infeasible_ != true) goto LAB_002dc2e8;
        }
        HighsDomain::conflictAnalysis
                  (&localdom,
                   &((this->mipsolver->mipdata_)._M_t.
                     super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                     .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->conflictPool
                  );
      }
LAB_002dc2e8:
    }
    pVar16 = std::
             _Hashtable<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>,std::__detail::_Identity,HighsVectorEqual,HighsVectorHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
             ::_M_emplace<std::vector<int,std::allocator<int>>&>
                       ((_Hashtable<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>,std::__detail::_Identity,HighsVectorEqual,HighsVectorHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                         *)&referencepoints,&referencepoint);
    uVar8 = pVar16._8_8_;
    for (uVar7 = 0; ((uVar8 & 1) == 0 && (uVar7 < 2)); uVar7 = uVar7 + 1) {
      iVar11 = 10;
      while (bVar12 = iVar11 != 0, iVar11 = iVar11 + -1, bVar12) {
        _Var2._M_head_impl =
             (this->mipsolver->mipdata_)._M_t.
             super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
             _M_t.
             super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
             super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
        HVar6 = HighsRandom::integer
                          (this_00,(HighsInt)
                                   ((ulong)((long)*(pointer *)
                                                   ((long)&(_Var2._M_head_impl)->integer_cols + 8) -
                                           *(long *)&((_Var2._M_head_impl)->integer_cols).
                                                     super__Vector_base<int,_std::allocator<int>_>)
                                   >> 2));
        pdVar4 = roundedsol.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        _Var2._M_head_impl =
             (this->mipsolver->mipdata_)._M_t.
             super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
             _M_t.
             super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
             super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
        lVar10 = (long)*(int *)(*(long *)&((_Var2._M_head_impl)->integer_cols).
                                          super__Vector_base<int,_std::allocator<int>_> +
                               (long)HVar6 * 4);
        dVar1 = roundedsol.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar10];
        dVar15 = lprelax.lpsolver.solution_.col_value.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar10];
        if (dVar1 <= dVar15) {
          if (dVar1 < dVar15) {
            dVar1 = ceil(dVar15);
            uVar13 = SUB84(dVar1,0);
            uVar14 = (undefined4)((ulong)dVar1 >> 0x20);
            goto LAB_002dc397;
          }
          dVar15 = *(double *)
                    (*(long *)&((vector<double,_std::allocator<double>_> *)
                               ((long)&(_Var2._M_head_impl)->domain + 800))->
                               super__Vector_base<double,_std::allocator<double>_> + lVar10 * 8);
          if (dVar15 <= dVar1) {
            dVar15 = *(double *)
                      (*(long *)&((vector<double,_std::allocator<double>_> *)
                                 ((long)&(_Var2._M_head_impl)->domain + 0x308))->
                                 super__Vector_base<double,_std::allocator<double>_> + lVar10 * 8);
          }
        }
        else {
          dVar1 = floor(dVar15);
          uVar13 = SUB84(dVar1,0);
          uVar14 = (undefined4)((ulong)dVar1 >> 0x20);
LAB_002dc397:
          dVar15 = (double)(int)(double)CONCAT44(uVar14,uVar13);
        }
        pdVar4[lVar10] = dVar15;
        referencepoint.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_start[HVar6] = (int)dVar15;
      }
      pVar16 = std::
               _Hashtable<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>,std::__detail::_Identity,HighsVectorEqual,HighsVectorHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
               ::_M_emplace<std::vector<int,std::allocator<int>>&>
                         ((_Hashtable<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>,std::__detail::_Identity,HighsVectorEqual,HighsVectorHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                           *)&referencepoints,&referencepoint);
      uVar8 = pVar16._8_8_;
    }
    if ((uVar8 & 1) == 0) {
LAB_002dc574:
      HighsDomain::~HighsDomain(&localdom);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&referencepoint.super__Vector_base<int,_std::allocator<int>_>);
      goto LAB_002dc5ed;
    }
    bVar12 = linesearchRounding(this,&lprelax.lpsolver.solution_.col_value,&roundedsol,2);
    if (bVar12) goto LAB_002dc574;
    _Var2._M_head_impl =
         (this->mipsolver->mipdata_)._M_t.
         super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
         super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
         super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
    if ((_Var2._M_head_impl)->avgrootlpiters * 5.0 + 1000.0 <= (double)lprelax.numlpiters) {
LAB_002dc58d:
      HighsDomain::~HighsDomain(&localdom);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&referencepoint.super__Vector_base<int,_std::allocator<int>_>);
      if (lprelax.fractionalints.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          lprelax.fractionalints.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish) goto LAB_002dc5ed;
      goto LAB_002dc5b6;
    }
    piVar3 = *(pointer *)((long)&(_Var2._M_head_impl)->integer_cols + 8);
    for (piVar9 = *(int **)&((_Var2._M_head_impl)->integer_cols).
                            super__Vector_base<int,_std::allocator<int>_>; piVar9 != piVar3;
        piVar9 = piVar9 + 1) {
      lVar10 = (long)*piVar9;
      _Var2._M_head_impl =
           (this->mipsolver->mipdata_)._M_t.
           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
           super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
      dVar1 = 0.0;
      if ((*(int *)(*(long *)&((_Var2._M_head_impl)->uplocks).
                              super__Vector_base<int,_std::allocator<int>_> + lVar10 * 4) != 0) &&
         (dVar1 = 0.0,
         *(int *)(*(long *)&((_Var2._M_head_impl)->downlocks).
                            super__Vector_base<int,_std::allocator<int>_> + lVar10 * 4) != 0)) {
        if (lprelax.lpsolver.solution_.col_value.super__Vector_base<double,_std::allocator<double>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar10] <=
            roundedsol.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar10] - (_Var2._M_head_impl)->feastol) {
          dVar1 = HighsRandom::closedFraction(this_00);
          dVar1 = dVar1 * 0.0002 + -0.0001 + 1.0;
        }
        else {
          dVar1 = HighsRandom::closedFraction(this_00);
          dVar1 = dVar1 * 0.0002 + -0.0001 + -1.0;
        }
      }
      cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar10] = dVar1;
    }
    Highs::changeColsCost
              (&lprelax.lpsolver,
               mask.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start,cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
    iVar5 = lprelax.numlpiters;
    local_5804 = HighsLpRelaxation::resolveLp(&lprelax,(HighsDomain *)0x0);
    if (lprelax.numlpiters - iVar5 == 0) goto LAB_002dc58d;
    this->lp_iterations = this->lp_iterations + (lprelax.numlpiters - iVar5);
    HighsDomain::~HighsDomain(&localdom);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&referencepoint.super__Vector_base<int,_std::allocator<int>_>);
  } while( true );
}

Assistant:

void HighsPrimalHeuristics::feasibilityPump() {
  HighsLpRelaxation lprelax(mipsolver.mipdata_->lp);
  std::unordered_set<std::vector<HighsInt>, HighsVectorHasher, HighsVectorEqual>
      referencepoints;
  std::vector<double> roundedsol;
  HighsLpRelaxation::Status status = lprelax.resolveLp();
  lp_iterations += lprelax.getNumLpIterations();

  std::vector<double> fracintcost;
  std::vector<HighsInt> fracintset;

  std::vector<HighsInt> mask(mipsolver.model_->num_col_, 1);
  std::vector<double> cost(mipsolver.model_->num_col_, 0.0);

  lprelax.getLpSolver().setOptionValue("simplex_strategy",
                                       kSimplexStrategyPrimal);
  lprelax.setObjectiveLimit();
  lprelax.getLpSolver().setOptionValue(
      "primal_simplex_bound_perturbation_multiplier", 0.0);

  lprelax.setIterationLimit(5 * mipsolver.mipdata_->avgrootlpiters);

  while (!lprelax.getFractionalIntegers().empty()) {
    const auto& lpsol = lprelax.getLpSolver().getSolution().col_value;
    roundedsol = lprelax.getLpSolver().getSolution().col_value;

    std::vector<HighsInt> referencepoint;
    referencepoint.reserve(mipsolver.mipdata_->integer_cols.size());

    auto localdom = mipsolver.mipdata_->domain;
    for (HighsInt i : mipsolver.mipdata_->integer_cols) {
      assert(mipsolver.variableType(i) == HighsVarType::kInteger);
      double intval = std::floor(roundedsol[i] + randgen.real(0.4, 0.6));
      intval = std::max(intval, localdom.col_lower_[i]);
      intval = std::min(intval, localdom.col_upper_[i]);
      roundedsol[i] = intval;
      referencepoint.push_back((HighsInt)intval);
      if (!localdom.infeasible()) {
        localdom.fixCol(i, intval, HighsDomain::Reason::branching());
        if (localdom.infeasible()) {
          localdom.conflictAnalysis(mipsolver.mipdata_->conflictPool);
          continue;
        }
        localdom.propagate();
        if (localdom.infeasible()) {
          localdom.conflictAnalysis(mipsolver.mipdata_->conflictPool);
          continue;
        }
      }
    }

    bool havecycle = !referencepoints.emplace(referencepoint).second;
    for (HighsInt k = 0; havecycle && k < 2; ++k) {
      for (HighsInt i = 0; i != 10; ++i) {
        HighsInt flippos =
            randgen.integer(mipsolver.mipdata_->integer_cols.size());
        HighsInt col = mipsolver.mipdata_->integer_cols[flippos];
        if (roundedsol[col] > lpsol[col])
          roundedsol[col] = (HighsInt)std::floor(lpsol[col]);
        else if (roundedsol[col] < lpsol[col])
          roundedsol[col] = (HighsInt)std::ceil(lpsol[col]);
        else if (roundedsol[col] < mipsolver.mipdata_->domain.col_upper_[col])
          roundedsol[col] = mipsolver.mipdata_->domain.col_upper_[col];
        else
          roundedsol[col] = mipsolver.mipdata_->domain.col_lower_[col];

        referencepoint[flippos] = (HighsInt)roundedsol[col];
      }
      havecycle = !referencepoints.emplace(referencepoint).second;
    }

    if (havecycle) return;

    if (linesearchRounding(lpsol, roundedsol, kSolutionSourceFeasibilityPump))
      return;

    if (lprelax.getNumLpIterations() >=
        1000 + mipsolver.mipdata_->avgrootlpiters * 5)
      break;

    for (HighsInt i : mipsolver.mipdata_->integer_cols) {
      assert(mipsolver.variableType(i) == HighsVarType::kInteger);

      if (mipsolver.mipdata_->uplocks[i] == 0 ||
          mipsolver.mipdata_->downlocks[i] == 0)
        cost[i] = 0.0;
      else if (lpsol[i] > roundedsol[i] - mipsolver.mipdata_->feastol)
        cost[i] = -1.0 + randgen.real(-1e-4, 1e-4);
      else
        cost[i] = 1.0 + randgen.real(-1e-4, 1e-4);
    }

    lprelax.getLpSolver().changeColsCost(mask.data(), cost.data());
    int64_t niters = -lprelax.getNumLpIterations();
    status = lprelax.resolveLp();
    niters += lprelax.getNumLpIterations();
    if (niters == 0) break;
    lp_iterations += niters;
  }

  if (lprelax.getFractionalIntegers().empty() &&
      lprelax.unscaledPrimalFeasible(status))
    mipsolver.mipdata_->addIncumbent(
        lprelax.getLpSolver().getSolution().col_value, lprelax.getObjective(),
        kSolutionSourceFeasibilityPump);
}